

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void argsman_tests::TestParse(string *str,bool expected_bool,int64_t expected_int)

{
  long lVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  char **ppcVar5;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  check_type cVar6;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  allocator<char> local_399;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  lazy_ostream local_348;
  undefined1 *local_338;
  char **local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  int64_t expected_int_local;
  bool expected_bool_local;
  string local_2f8;
  string error;
  char *argv [2];
  string arg;
  TestArgsManager test;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  expected_int_local = expected_int;
  expected_bool_local = expected_bool;
  TestArgsManager::TestArgsManager(&test);
  local_348._vptr_lazy_ostream = (_func_int **)CONCAT44(local_348._vptr_lazy_ostream._4_4_,1);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)&arg,(char (*) [7])"-value",(Flags *)&local_348);
  __l._M_len = 1;
  __l._M_array = (iterator)&arg;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&error,__l,(allocator_type *)&local_2f8);
  TestArgsManager::SetupArgs
            (&test,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)&error);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&error);
  std::__cxx11::string::~string((string *)&arg);
  std::operator+(&arg,"-value=",str);
  argv[0] = "ignored";
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  argv[1] = arg._M_dataplus._M_p;
  error.field_2._M_local_buf[0] = '\0';
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x112;
  file.m_begin = (iterator)&local_318;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_328,msg);
  _cVar6 = 0x21abdd;
  local_2f8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test.super_ArgsManager,2,argv,&error);
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_allocated_capacity = 0;
  local_330 = &local_358;
  local_358 = "test.ParseParameters(2, argv, error)";
  local_350 = "";
  local_348.m_empty = false;
  local_348._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_338 = boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_360 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2f8,&local_348,1,0,WARN,_cVar6,(size_t)&local_368,0x112);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2f8.field_2._M_allocated_capacity);
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x113;
  file_00.m_begin = (iterator)&local_378;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_388,
             msg_00);
  local_348.m_empty = false;
  local_348._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_338 = boost::unit_test::lazy_ostream::inst;
  local_330 = (char **)0xc7f1cc;
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_390 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"-value",&local_399);
  bVar2 = ArgsManager::GetBoolArg(&test.super_ArgsManager,&local_2f8,false);
  ppcVar5 = &local_358;
  pvVar3 = (iterator)0x2;
  local_358._0_1_ = bVar2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_348,&local_398,0x113,1,2,ppcVar5,"test.GetBoolArg(\"-value\", false)",
             &expected_bool_local,"expected_bool");
  std::__cxx11::string::~string((string *)&local_2f8);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x114;
  file_01.m_begin = (iterator)&local_3b0;
  msg_01.m_end = (iterator)ppcVar5;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3c0,
             msg_01);
  local_348.m_empty = false;
  local_348._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_338 = boost::unit_test::lazy_ostream::inst;
  local_330 = (char **)0xc7f1cc;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_3c8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"-value",&local_399);
  bVar2 = ArgsManager::GetBoolArg(&test.super_ArgsManager,&local_2f8,true);
  ppcVar5 = &local_358;
  local_358 = (char *)CONCAT71(local_358._1_7_,bVar2);
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_348,&local_3d0,0x114,1,2,ppcVar5,"test.GetBoolArg(\"-value\", true)",
             &expected_bool_local,"expected_bool");
  std::__cxx11::string::~string((string *)&local_2f8);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x115;
  file_02.m_begin = (iterator)&local_3e0;
  msg_02.m_end = (iterator)ppcVar5;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3f0,
             msg_02);
  local_348.m_empty = false;
  local_348._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_338 = boost::unit_test::lazy_ostream::inst;
  local_330 = (char **)0xc7f1cc;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_3f8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"-value",&local_399);
  local_358 = (char *)ArgsManager::GetIntArg(&test.super_ArgsManager,&local_2f8,0x1869e);
  ppcVar5 = &local_358;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_348,&local_400,0x115,1,2,ppcVar5,"test.GetIntArg(\"-value\", 99998)",
             &expected_int_local,"expected_int");
  std::__cxx11::string::~string((string *)&local_2f8);
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x116;
  file_03.m_begin = (iterator)&local_410;
  msg_03.m_end = (iterator)ppcVar5;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_420,
             msg_03);
  local_348.m_empty = false;
  local_348._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_338 = boost::unit_test::lazy_ostream::inst;
  local_330 = (char **)0xc7f1cc;
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_428 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"-value",&local_399);
  local_358 = (char *)ArgsManager::GetIntArg(&test.super_ArgsManager,&local_2f8,99999);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_348,&local_430,0x116,1,2,&local_358,"test.GetIntArg(\"-value\", 99999)",
             &expected_int_local,"expected_int");
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&arg);
  ArgsManager::~ArgsManager(&test.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestParse(const std::string& str, bool expected_bool, int64_t expected_int)
{
    TestArgsManager test;
    test.SetupArgs({{"-value", ArgsManager::ALLOW_ANY}});
    std::string arg = "-value=" + str;
    const char* argv[] = {"ignored", arg.c_str()};
    std::string error;
    BOOST_CHECK(test.ParseParameters(2, argv, error));
    BOOST_CHECK_EQUAL(test.GetBoolArg("-value", false), expected_bool);
    BOOST_CHECK_EQUAL(test.GetBoolArg("-value", true), expected_bool);
    BOOST_CHECK_EQUAL(test.GetIntArg("-value", 99998), expected_int);
    BOOST_CHECK_EQUAL(test.GetIntArg("-value", 99999), expected_int);
}